

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_show_help(char *name)

{
  size_t sVar1;
  ulong uVar2;
  MppOptInfo *opt_1;
  MppOptInfo *opt;
  RK_U32 i;
  RK_U32 len;
  char logs [256];
  uint local_1c;
  uint local_18;
  RK_U32 max_help;
  RK_U32 max_full_name;
  RK_U32 max_name;
  char *name_local;
  
  max_help = 1;
  local_18 = 1;
  local_1c = 1;
  _mpp_log_l(4,"mpi_enc_utils","usage: %s [options]\n",0,name);
  for (opt._0_4_ = 0; (uint)opt < enc_opt_cnt; opt._0_4_ = (uint)opt + 1) {
    uVar2 = (ulong)(uint)opt;
    if (enc_opts[uVar2].name != (char *)0x0) {
      sVar1 = strlen(enc_opts[uVar2].name);
      if (max_help < (uint)sVar1) {
        max_help = (uint)sVar1;
      }
    }
    if (enc_opts[uVar2].full_name != (char *)0x0) {
      sVar1 = strlen(enc_opts[uVar2].full_name);
      if (local_18 < (uint)sVar1) {
        local_18 = (uint)sVar1;
      }
    }
    if (enc_opts[uVar2].help != (char *)0x0) {
      sVar1 = strlen(enc_opts[uVar2].help);
      if (local_1c < (uint)sVar1) {
        local_1c = (uint)sVar1;
      }
    }
  }
  snprintf((char *)&i,0xff,"-%%-%ds %%-%ds %%-%ds\n",(ulong)max_help,(ulong)local_18,(ulong)local_1c
          );
  for (opt._0_4_ = 0; (uint)opt < enc_opt_cnt; opt._0_4_ = (uint)opt + 1) {
    uVar2 = (ulong)(uint)opt;
    _mpp_log_l(4,"mpi_enc_utils",&i,0,enc_opts[uVar2].name,enc_opts[uVar2].full_name,
               enc_opts[uVar2].help);
  }
  mpp_show_support_format();
  mpp_show_color_format();
  return -1;
}

Assistant:

RK_S32 mpi_enc_show_help(const char *name)
{
    RK_U32 max_name = 1;
    RK_U32 max_full_name = 1;
    RK_U32 max_help = 1;
    char logs[256];
    RK_U32 len;
    RK_U32 i;

    mpp_log("usage: %s [options]\n", name);

    for (i = 0; i < enc_opt_cnt; i++) {
        MppOptInfo *opt = &enc_opts[i];

        if (opt->name) {
            len = strlen(opt->name);
            if (len > max_name)
                max_name = len;
        }

        if (opt->full_name) {
            len = strlen(opt->full_name);
            if (len > max_full_name)
                max_full_name = len;
        }

        if (opt->help) {
            len = strlen(opt->help);
            if (len > max_help)
                max_help = len;
        }
    }

    snprintf(logs, sizeof(logs) - 1, "-%%-%ds %%-%ds %%-%ds\n", max_name, max_full_name, max_help);

    for (i = 0; i < enc_opt_cnt; i++) {
        MppOptInfo *opt = &enc_opts[i];

        mpp_log(logs, opt->name, opt->full_name, opt->help);
    }
    mpp_show_support_format();
    mpp_show_color_format();

    return -1;
}